

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O0

int I_GetTimePolled(bool saveMS)

{
  DWORD DVar1;
  DWORD tm;
  bool saveMS_local;
  
  if (TicFrozen == 0) {
    DVar1 = SDL_GetTicks();
    if (saveMS) {
      TicStart = DVar1;
    }
    tm = Scale(DVar1 - BaseTime,0x23,1000);
  }
  else {
    tm = TicFrozen;
  }
  return tm;
}

Assistant:

int I_GetTimePolled (bool saveMS)
{
	if (TicFrozen != 0)
	{
		return TicFrozen;
	}

	DWORD tm = SDL_GetTicks();

	if (saveMS)
	{
		TicStart = tm;
	}
	return Scale(tm - BaseTime, TICRATE, 1000);
}